

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_self_test(int verbose)

{
  uchar auVar1 [16];
  uchar auVar2 [16];
  int iVar3;
  uchar (*pauVar4) [32];
  uchar (*pauVar5) [16];
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  size_t __n;
  uint keybits;
  uint uVar9;
  uchar *puVar10;
  uchar (*pauVar11) [48];
  int iVar12;
  uchar (*pauVar13) [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  size_t offset;
  uchar buf [64];
  uchar local_408 [16];
  undefined1 local_3f8 [16];
  uchar iv [16];
  uchar prv [16];
  uchar nonce_counter [16];
  uchar stream_block [16];
  mbedtls_aes_context ctx;
  mbedtls_aes_xts_context ctx_xts;
  uchar tmp [16];
  
  local_408[0] = '\0';
  local_408[1] = '\0';
  local_408[2] = '\0';
  local_408[3] = '\0';
  local_408[4] = '\0';
  local_408[5] = '\0';
  local_408[6] = '\0';
  local_408[7] = '\0';
  local_408[8] = '\0';
  local_408[9] = '\0';
  local_408[10] = '\0';
  local_408[0xb] = '\0';
  local_408[0xc] = '\0';
  local_408[0xd] = '\0';
  local_408[0xe] = '\0';
  local_408[0xf] = '\0';
  local_3f8 = (undefined1  [16])0x0;
  memset(&ctx,0,0x120);
  for (uVar8 = 0; uVar8 != 6; uVar8 = uVar8 + 1) {
    uVar9 = (uVar8 >> 1) * 0x40 + 0x80;
    uVar7 = uVar8 & 1;
    if (verbose != 0) {
      pcVar6 = "enc";
      if (uVar7 == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-ECB-%3d (%s): ",(ulong)uVar9,pcVar6);
    }
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    if (uVar7 == 0) {
      iVar3 = mbedtls_aes_setkey_dec(&ctx,local_408,uVar9);
      pauVar5 = aes_test_ecb_dec;
    }
    else {
      iVar3 = mbedtls_aes_setkey_enc(&ctx,local_408,uVar9);
      pauVar5 = aes_test_ecb_enc;
    }
    pcVar6 = "skipped";
    if (uVar9 == 0xc0 && iVar3 == -0x72) {
LAB_00131730:
      puts(pcVar6);
    }
    else {
      if (iVar3 != 0) goto LAB_00131eff;
      pauVar5 = pauVar5 + (uVar8 >> 1);
      iVar12 = 0x2711;
      while (iVar12 = iVar12 + -1, iVar12 != 0) {
        iVar3 = mbedtls_aes_crypt_ecb(&ctx,uVar7,buf,buf);
        if (iVar3 != 0) goto LAB_00131eff;
      }
      auVar14[0] = -((*pauVar5)[0] == buf[0]);
      auVar14[1] = -((*pauVar5)[1] == buf[1]);
      auVar14[2] = -((*pauVar5)[2] == buf[2]);
      auVar14[3] = -((*pauVar5)[3] == buf[3]);
      auVar14[4] = -((*pauVar5)[4] == buf[4]);
      auVar14[5] = -((*pauVar5)[5] == buf[5]);
      auVar14[6] = -((*pauVar5)[6] == buf[6]);
      auVar14[7] = -((*pauVar5)[7] == buf[7]);
      auVar14[8] = -((*pauVar5)[8] == buf[8]);
      auVar14[9] = -((*pauVar5)[9] == buf[9]);
      auVar14[10] = -((*pauVar5)[10] == buf[10]);
      auVar14[0xb] = -((*pauVar5)[0xb] == buf[0xb]);
      auVar14[0xc] = -((*pauVar5)[0xc] == buf[0xc]);
      auVar14[0xd] = -((*pauVar5)[0xd] == buf[0xd]);
      auVar14[0xe] = -((*pauVar5)[0xe] == buf[0xe]);
      auVar14[0xf] = -((*pauVar5)[0xf] == buf[0xf]);
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00131f33;
      pcVar6 = "passed";
      if (verbose != 0) goto LAB_00131730;
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar8 = 0; uVar8 != 6; uVar8 = uVar8 + 1) {
    uVar9 = (uVar8 >> 1) * 0x40 + 0x80;
    uVar7 = uVar8 & 1;
    if (verbose != 0) {
      pcVar6 = "enc";
      if (uVar7 == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-CBC-%3d (%s): ",(ulong)uVar9,pcVar6);
    }
    iv[0] = '\0';
    iv[1] = '\0';
    iv[2] = '\0';
    iv[3] = '\0';
    iv[4] = '\0';
    iv[5] = '\0';
    iv[6] = '\0';
    iv[7] = '\0';
    iv[8] = '\0';
    iv[9] = '\0';
    iv[10] = '\0';
    iv[0xb] = '\0';
    iv[0xc] = '\0';
    iv[0xd] = '\0';
    iv[0xe] = '\0';
    iv[0xf] = '\0';
    prv[0] = '\0';
    prv[1] = '\0';
    prv[2] = '\0';
    prv[3] = '\0';
    prv[4] = '\0';
    prv[5] = '\0';
    prv[6] = '\0';
    prv[7] = '\0';
    prv[8] = '\0';
    prv[9] = '\0';
    prv[10] = '\0';
    prv[0xb] = '\0';
    prv[0xc] = '\0';
    prv[0xd] = '\0';
    prv[0xe] = '\0';
    prv[0xf] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    if (uVar7 == 0) {
      iVar3 = mbedtls_aes_setkey_dec(&ctx,local_408,uVar9);
      pauVar5 = aes_test_cbc_dec;
    }
    else {
      iVar3 = mbedtls_aes_setkey_enc(&ctx,local_408,uVar9);
      pauVar5 = aes_test_cbc_enc;
    }
    pcVar6 = "skipped";
    if (uVar9 == 0xc0 && iVar3 == -0x72) {
LAB_0013189c:
      puts(pcVar6);
    }
    else {
      if (iVar3 != 0) goto LAB_00131eff;
      pauVar5 = pauVar5 + (uVar8 >> 1);
      iVar12 = 0x2711;
      while (auVar1 = prv, iVar12 = iVar12 + -1, iVar12 != 0) {
        if (uVar7 != 0) {
          prv[0] = buf[0];
          prv[1] = buf[1];
          prv[2] = buf[2];
          prv[3] = buf[3];
          prv[4] = buf[4];
          prv[5] = buf[5];
          prv[6] = buf[6];
          prv[7] = buf[7];
          prv[8] = buf[8];
          prv[9] = buf[9];
          prv[10] = buf[10];
          prv[0xb] = buf[0xb];
          prv[0xc] = buf[0xc];
          prv[0xd] = buf[0xd];
          prv[0xe] = buf[0xe];
          prv[0xf] = buf[0xf];
          auVar2 = prv;
          prv[0] = auVar1[0];
          prv[1] = auVar1[1];
          prv[2] = auVar1[2];
          prv[3] = auVar1[3];
          prv[4] = auVar1[4];
          prv[5] = auVar1[5];
          prv[6] = auVar1[6];
          prv[7] = auVar1[7];
          prv[8] = auVar1[8];
          prv[9] = auVar1[9];
          prv[10] = auVar1[10];
          prv[0xb] = auVar1[0xb];
          prv[0xc] = auVar1[0xc];
          prv[0xd] = auVar1[0xd];
          prv[0xe] = auVar1[0xe];
          prv[0xf] = auVar1[0xf];
          buf[0] = prv[0];
          buf[1] = prv[1];
          buf[2] = prv[2];
          buf[3] = prv[3];
          buf[4] = prv[4];
          buf[5] = prv[5];
          buf[6] = prv[6];
          buf[7] = prv[7];
          buf[8] = prv[8];
          buf[9] = prv[9];
          buf[10] = prv[10];
          buf[0xb] = prv[0xb];
          buf[0xc] = prv[0xc];
          buf[0xd] = prv[0xd];
          buf[0xe] = prv[0xe];
          buf[0xf] = prv[0xf];
          prv = auVar2;
        }
        iVar3 = mbedtls_aes_crypt_cbc(&ctx,uVar7,0x10,iv,buf,buf);
        if (iVar3 != 0) goto LAB_00131eff;
      }
      auVar15[0] = -((*pauVar5)[0] == buf[0]);
      auVar15[1] = -((*pauVar5)[1] == buf[1]);
      auVar15[2] = -((*pauVar5)[2] == buf[2]);
      auVar15[3] = -((*pauVar5)[3] == buf[3]);
      auVar15[4] = -((*pauVar5)[4] == buf[4]);
      auVar15[5] = -((*pauVar5)[5] == buf[5]);
      auVar15[6] = -((*pauVar5)[6] == buf[6]);
      auVar15[7] = -((*pauVar5)[7] == buf[7]);
      auVar15[8] = -((*pauVar5)[8] == buf[8]);
      auVar15[9] = -((*pauVar5)[9] == buf[9]);
      auVar15[10] = -((*pauVar5)[10] == buf[10]);
      auVar15[0xb] = -((*pauVar5)[0xb] == buf[0xb]);
      auVar15[0xc] = -((*pauVar5)[0xc] == buf[0xc]);
      auVar15[0xd] = -((*pauVar5)[0xd] == buf[0xd]);
      auVar15[0xe] = -((*pauVar5)[0xe] == buf[0xe]);
      auVar15[0xf] = -((*pauVar5)[0xf] == buf[0xf]);
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00131f33;
      pcVar6 = "passed";
      if (verbose != 0) goto LAB_0013189c;
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar8 = 0; uVar8 != 6; uVar8 = uVar8 + 1) {
    uVar9 = uVar8 >> 1;
    keybits = uVar9 * 0x40 + 0x80;
    uVar7 = uVar8 & 1;
    if (verbose != 0) {
      pcVar6 = "enc";
      if (uVar7 == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-CFB128-%3d (%s): ",(ulong)keybits,pcVar6);
    }
    iv[8] = '\b';
    iv[9] = '\t';
    iv[10] = '\n';
    iv[0xb] = '\v';
    iv[0xc] = '\f';
    iv[0xd] = '\r';
    iv[0xe] = '\x0e';
    iv[0xf] = '\x0f';
    iv[0] = '\0';
    iv[1] = '\x01';
    iv[2] = '\x02';
    iv[3] = '\x03';
    iv[4] = '\x04';
    iv[5] = '\x05';
    iv[6] = '\x06';
    iv[7] = '\a';
    memcpy(local_408,aes_test_cfb128_key + uVar9,(ulong)(keybits >> 3));
    offset = 0;
    iVar3 = mbedtls_aes_setkey_enc(&ctx,local_408,keybits);
    pcVar6 = "skipped";
    if (keybits == 0xc0 && iVar3 == -0x72) {
LAB_00131a60:
      puts(pcVar6);
    }
    else {
      if (iVar3 != 0) goto LAB_00131eff;
      if (uVar7 == 0) {
        buf._0_16_ = *(undefined1 (*) [16])aes_test_cfb128_ct[uVar9];
        buf._16_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x10);
        buf._24_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x18);
        buf._32_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x20);
        buf._40_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x28);
        buf._48_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x30);
        buf._56_8_ = *(undefined8 *)(aes_test_cfb128_ct[uVar9] + 0x38);
        puVar10 = aes_test_cfb128_pt;
      }
      else {
        buf[0x30] = 0xf6;
        buf[0x31] = 0x9f;
        buf[0x32] = '$';
        buf[0x33] = 'E';
        buf[0x34] = 0xdf;
        buf[0x35] = 'O';
        buf[0x36] = 0x9b;
        buf[0x37] = '\x17';
        buf[0x38] = 0xad;
        buf[0x39] = '+';
        buf[0x3a] = 'A';
        buf[0x3b] = '{';
        buf[0x3c] = 0xe6;
        buf[0x3d] = 'l';
        buf[0x3e] = '7';
        buf[0x3f] = '\x10';
        buf[0x20] = '0';
        buf[0x21] = 200;
        buf[0x22] = '\x1c';
        buf[0x23] = 'F';
        buf[0x24] = 0xa3;
        buf[0x25] = '\\';
        buf[0x26] = 0xe4;
        buf[0x27] = '\x11';
        buf[0x28] = 0xe5;
        buf[0x29] = 0xfb;
        buf[0x2a] = 0xc1;
        buf[0x2b] = '\x19';
        buf[0x2c] = '\x1a';
        buf[0x2d] = '\n';
        buf[0x2e] = 'R';
        buf[0x2f] = 0xef;
        buf[0x10] = 0xae;
        buf[0x11] = '-';
        buf[0x12] = 0x8a;
        buf[0x13] = 'W';
        buf[0x14] = '\x1e';
        buf[0x15] = '\x03';
        buf[0x16] = 0xac;
        buf[0x17] = 0x9c;
        buf[0x18] = 0x9e;
        buf[0x19] = 0xb7;
        buf[0x1a] = 'o';
        buf[0x1b] = 0xac;
        buf[0x1c] = 'E';
        buf[0x1d] = 0xaf;
        buf[0x1e] = 0x8e;
        buf[0x1f] = 'Q';
        buf[8] = 0xe9;
        buf[9] = '=';
        buf[10] = '~';
        buf[0xb] = '\x11';
        buf[0xc] = 's';
        buf[0xd] = 0x93;
        buf[0xe] = '\x17';
        buf[0xf] = '*';
        buf[0] = 'k';
        buf[1] = 0xc1;
        buf[2] = 0xbe;
        buf[3] = 0xe2;
        buf[4] = '.';
        buf[5] = '@';
        buf[6] = 0x9f;
        buf[7] = 0x96;
        puVar10 = aes_test_cfb128_ct[uVar9];
      }
      iVar3 = mbedtls_aes_crypt_cfb128(&ctx,uVar7,0x40,&offset,iv,buf,buf);
      if (iVar3 != 0) goto LAB_00131eff;
      iVar3 = bcmp(buf,puVar10,0x40);
      if (iVar3 != 0) goto LAB_00131f33;
      pcVar6 = "passed";
      if (verbose != 0) goto LAB_00131a60;
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  for (uVar8 = 0; uVar8 != 6; uVar8 = uVar8 + 1) {
    uVar7 = uVar8 >> 1;
    uVar9 = uVar7 * 0x40 + 0x80;
    if (verbose != 0) {
      pcVar6 = "enc";
      if ((uVar8 & 1) == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-OFB-%3d (%s): ",(ulong)uVar9,pcVar6);
    }
    iv[8] = '\b';
    iv[9] = '\t';
    iv[10] = '\n';
    iv[0xb] = '\v';
    iv[0xc] = '\f';
    iv[0xd] = '\r';
    iv[0xe] = '\x0e';
    iv[0xf] = '\x0f';
    iv[0] = '\0';
    iv[1] = '\x01';
    iv[2] = '\x02';
    iv[3] = '\x03';
    iv[4] = '\x04';
    iv[5] = '\x05';
    iv[6] = '\x06';
    iv[7] = '\a';
    memcpy(local_408,aes_test_cfb128_key + uVar7,(ulong)(uVar9 >> 3));
    offset = 0;
    iVar3 = mbedtls_aes_setkey_enc(&ctx,local_408,uVar9);
    pcVar6 = "skipped";
    if (uVar9 == 0xc0 && iVar3 == -0x72) {
LAB_00131c1e:
      puts(pcVar6);
    }
    else {
      if (iVar3 != 0) goto LAB_00131eff;
      if ((uVar8 & 1) == 0) {
        buf._0_16_ = *(undefined1 (*) [16])aes_test_ofb_ct[uVar7];
        buf._16_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x10);
        buf._24_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x18);
        buf._32_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x20);
        buf._40_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x28);
        buf._48_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x30);
        buf._56_8_ = *(undefined8 *)(aes_test_ofb_ct[uVar7] + 0x38);
        puVar10 = aes_test_ofb_pt;
      }
      else {
        buf[0x30] = 0xf6;
        buf[0x31] = 0x9f;
        buf[0x32] = '$';
        buf[0x33] = 'E';
        buf[0x34] = 0xdf;
        buf[0x35] = 'O';
        buf[0x36] = 0x9b;
        buf[0x37] = '\x17';
        buf[0x38] = 0xad;
        buf[0x39] = '+';
        buf[0x3a] = 'A';
        buf[0x3b] = '{';
        buf[0x3c] = 0xe6;
        buf[0x3d] = 'l';
        buf[0x3e] = '7';
        buf[0x3f] = '\x10';
        buf[0x20] = '0';
        buf[0x21] = 200;
        buf[0x22] = '\x1c';
        buf[0x23] = 'F';
        buf[0x24] = 0xa3;
        buf[0x25] = '\\';
        buf[0x26] = 0xe4;
        buf[0x27] = '\x11';
        buf[0x28] = 0xe5;
        buf[0x29] = 0xfb;
        buf[0x2a] = 0xc1;
        buf[0x2b] = '\x19';
        buf[0x2c] = '\x1a';
        buf[0x2d] = '\n';
        buf[0x2e] = 'R';
        buf[0x2f] = 0xef;
        buf[0x10] = 0xae;
        buf[0x11] = '-';
        buf[0x12] = 0x8a;
        buf[0x13] = 'W';
        buf[0x14] = '\x1e';
        buf[0x15] = '\x03';
        buf[0x16] = 0xac;
        buf[0x17] = 0x9c;
        buf[0x18] = 0x9e;
        buf[0x19] = 0xb7;
        buf[0x1a] = 'o';
        buf[0x1b] = 0xac;
        buf[0x1c] = 'E';
        buf[0x1d] = 0xaf;
        buf[0x1e] = 0x8e;
        buf[0x1f] = 'Q';
        buf[8] = 0xe9;
        buf[9] = '=';
        buf[10] = '~';
        buf[0xb] = '\x11';
        buf[0xc] = 's';
        buf[0xd] = 0x93;
        buf[0xe] = '\x17';
        buf[0xf] = '*';
        buf[0] = 'k';
        buf[1] = 0xc1;
        buf[2] = 0xbe;
        buf[3] = 0xe2;
        buf[4] = '.';
        buf[5] = '@';
        buf[6] = 0x9f;
        buf[7] = 0x96;
        puVar10 = aes_test_ofb_ct[uVar7];
      }
      iVar3 = mbedtls_aes_crypt_ofb(&ctx,0x40,&offset,iv,buf,buf);
      if (iVar3 != 0) goto LAB_00131eff;
      iVar3 = bcmp(buf,puVar10,0x40);
      if (iVar3 != 0) goto LAB_00131f33;
      pcVar6 = "passed";
      if (verbose != 0) goto LAB_00131c1e;
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  uVar8 = 0;
  while( true ) {
    if (uVar8 == 6) break;
    if (verbose != 0) {
      pcVar6 = "enc";
      if ((uVar8 & 1) == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-CTR-128 (%s): ",pcVar6);
    }
    uVar7 = uVar8 >> 1;
    nonce_counter._0_8_ = *(undefined8 *)aes_test_ctr_nonce_counter[uVar7];
    nonce_counter._8_8_ = *(undefined8 *)(aes_test_ctr_nonce_counter[uVar7] + 8);
    local_408 = aes_test_ctr_key[uVar7];
    offset = 0;
    iVar3 = mbedtls_aes_setkey_enc(&ctx,local_408,0x80);
    if (iVar3 != 0) goto LAB_00131eff;
    __n = (size_t)aes_test_ctr_len[uVar7];
    pauVar11 = aes_test_ctr_pt;
    if ((uVar8 & 1) == 0) {
      pauVar11 = aes_test_ctr_ct;
    }
    memcpy(buf,pauVar11 + uVar7,__n);
    iVar3 = mbedtls_aes_crypt_ctr(&ctx,__n,&offset,nonce_counter,stream_block,buf,buf);
    if (iVar3 != 0) goto LAB_00131eff;
    pauVar11 = aes_test_ctr_ct;
    if ((uVar8 & 1) == 0) {
      pauVar11 = aes_test_ctr_pt;
    }
    iVar3 = bcmp(buf,pauVar11 + uVar7,__n);
    if (iVar3 != 0) goto LAB_00131f33;
    if (verbose != 0) {
      puts("passed");
    }
    uVar8 = uVar8 + 1;
  }
  if (verbose != 0) {
    putchar(10);
  }
  memset(&ctx_xts,0,0x240);
  for (uVar8 = 0; uVar8 != 6; uVar8 = uVar8 + 1) {
    uVar7 = uVar8 & 1;
    if (verbose != 0) {
      pcVar6 = "enc";
      if (uVar7 == 0) {
        pcVar6 = "dec";
      }
      printf("  AES-XTS-128 (%s): ",pcVar6);
    }
    uVar9 = uVar8 >> 1;
    local_408 = *(uchar (*) [16])aes_test_xts_key[uVar9];
    local_3f8 = *(undefined1 (*) [16])(aes_test_xts_key[uVar9] + 0x10);
    if (uVar7 == 0) {
      iVar3 = mbedtls_aes_xts_setkey_dec(&ctx_xts,local_408,0x100);
      pauVar4 = aes_test_xts_ct32;
      pauVar13 = aes_test_xts_pt32;
    }
    else {
      iVar3 = mbedtls_aes_xts_setkey_enc(&ctx_xts,local_408,0x100);
      pauVar4 = aes_test_xts_pt32;
      pauVar13 = aes_test_xts_ct32;
    }
    if (iVar3 != 0) goto LAB_00131eff;
    buf._0_16_ = *(undefined1 (*) [16])pauVar4[uVar9];
    buf._16_8_ = *(undefined8 *)(pauVar4[uVar9] + 0x10);
    buf._24_8_ = *(undefined8 *)(pauVar4[uVar9] + 0x10 + 8);
    iVar3 = mbedtls_aes_crypt_xts(&ctx_xts,uVar7,0x20,aes_test_xts_data_unit[uVar9],buf,buf);
    if (iVar3 != 0) goto LAB_00131eff;
    iVar3 = bcmp(buf,pauVar13 + uVar9,0x20);
    if ((verbose == 0) || (iVar3 != 0)) {
      if (iVar3 != 0) goto LAB_00131f33;
    }
    else {
      puts("passed");
    }
  }
  if (verbose != 0) {
    putchar(10);
  }
  mbedtls_aes_xts_free(&ctx_xts);
  iVar3 = 0;
LAB_00131f12:
  mbedtls_aes_free(&ctx);
  return iVar3;
LAB_00131f33:
  iVar3 = 1;
LAB_00131eff:
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_00131f12;
}

Assistant:

int mbedtls_aes_self_test( int verbose )
{
    int ret = 0, i, j, u, mode;
    unsigned int keybits;
    unsigned char key[32];
    unsigned char buf[64];
    const unsigned char *aes_tests;
#if defined(MBEDTLS_CIPHER_MODE_CBC) || defined(MBEDTLS_CIPHER_MODE_CFB)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char prv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_CFB) || \
    defined(MBEDTLS_CIPHER_MODE_OFB)
    size_t offset;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR) || defined(MBEDTLS_CIPHER_MODE_XTS)
    int len;
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif
    mbedtls_aes_context ctx;

    memset( key, 0, 32 );
    mbedtls_aes_init( &ctx );

    /*
     * ECB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-ECB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_ecb_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_ecb_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            ret = mbedtls_aes_crypt_ecb( &ctx, mode, buf, buf );
            if( ret != 0 )
                goto exit;
        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CBC-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( iv , 0, 16 );
        memset( prv, 0, 16 );
        memset( buf, 0, 16 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_setkey_dec( &ctx, key, keybits );
            aes_tests = aes_test_cbc_dec[u];
        }
        else
        {
            ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
            aes_tests = aes_test_cbc_enc[u];
        }

        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        for( j = 0; j < 10000; j++ )
        {
            if( mode == MBEDTLS_AES_ENCRYPT )
            {
                unsigned char tmp[16];

                memcpy( tmp, prv, 16 );
                memcpy( prv, buf, 16 );
                memcpy( buf, tmp, 16 );
            }

            ret = mbedtls_aes_crypt_cbc( &ctx, mode, 16, iv, buf, buf );
            if( ret != 0 )
                goto exit;

        }

        if( memcmp( buf, aes_tests, 16 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    /*
     * CFB128 mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CFB128-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_cfb128_iv, 16 );
        memcpy( key, aes_test_cfb128_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_cfb128_ct[u], 64 );
            aes_tests = aes_test_cfb128_pt;
        }
        else
        {
            memcpy( buf, aes_test_cfb128_pt, 64 );
            aes_tests = aes_test_cfb128_ct[u];
        }

        ret = mbedtls_aes_crypt_cfb128( &ctx, mode, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_OFB)
    /*
     * OFB mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        keybits = 128 + u * 64;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-OFB-%3d (%s): ", keybits,
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( iv,  aes_test_ofb_iv, 16 );
        memcpy( key, aes_test_ofb_key[u], keybits / 8 );

        offset = 0;
        ret = mbedtls_aes_setkey_enc( &ctx, key, keybits );
        /*
         * AES-192 is an optional feature that may be unavailable when
         * there is an alternative underlying implementation i.e. when
         * MBEDTLS_AES_ALT is defined.
         */
        if( ret == MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED && keybits == 192 )
        {
            mbedtls_printf( "skipped\n" );
            continue;
        }
        else if( ret != 0 )
        {
            goto exit;
        }

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ofb_ct[u], 64 );
            aes_tests = aes_test_ofb_pt;
        }
        else
        {
            memcpy( buf, aes_test_ofb_pt, 64 );
            aes_tests = aes_test_ofb_ct[u];
        }

        ret = mbedtls_aes_crypt_ofb( &ctx, 64, &offset, iv, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, 64 ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_OFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-CTR-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, aes_test_ctr_nonce_counter[u], 16 );
        memcpy( key, aes_test_ctr_key[u], 16 );

        offset = 0;
        if( ( ret = mbedtls_aes_setkey_enc( &ctx, key, 128 ) ) != 0 )
            goto exit;

        len = aes_test_ctr_len[u];

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            memcpy( buf, aes_test_ctr_ct[u], len );
            aes_tests = aes_test_ctr_pt[u];
        }
        else
        {
            memcpy( buf, aes_test_ctr_pt[u], len );
            aes_tests = aes_test_ctr_ct[u];
        }

        ret = mbedtls_aes_crypt_ctr( &ctx, len, &offset, nonce_counter,
                                     stream_block, buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

#if defined(MBEDTLS_CIPHER_MODE_XTS)
    {
    static const int num_tests =
        sizeof(aes_test_xts_key) / sizeof(*aes_test_xts_key);
    mbedtls_aes_xts_context ctx_xts;

    /*
     * XTS mode
     */
    mbedtls_aes_xts_init( &ctx_xts );

    for( i = 0; i < num_tests << 1; i++ )
    {
        const unsigned char *data_unit;
        u = i >> 1;
        mode = i & 1;

        if( verbose != 0 )
            mbedtls_printf( "  AES-XTS-128 (%s): ",
                            ( mode == MBEDTLS_AES_DECRYPT ) ? "dec" : "enc" );

        memset( key, 0, sizeof( key ) );
        memcpy( key, aes_test_xts_key[u], 32 );
        data_unit = aes_test_xts_data_unit[u];

        len = sizeof( *aes_test_xts_ct32 );

        if( mode == MBEDTLS_AES_DECRYPT )
        {
            ret = mbedtls_aes_xts_setkey_dec( &ctx_xts, key, 256 );
            if( ret != 0)
                goto exit;
            memcpy( buf, aes_test_xts_ct32[u], len );
            aes_tests = aes_test_xts_pt32[u];
        }
        else
        {
            ret = mbedtls_aes_xts_setkey_enc( &ctx_xts, key, 256 );
            if( ret != 0)
                goto exit;
            memcpy( buf, aes_test_xts_pt32[u], len );
            aes_tests = aes_test_xts_ct32[u];
        }


        ret = mbedtls_aes_crypt_xts( &ctx_xts, mode, len, data_unit,
                                     buf, buf );
        if( ret != 0 )
            goto exit;

        if( memcmp( buf, aes_tests, len ) != 0 )
        {
            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    mbedtls_aes_xts_free( &ctx_xts );
    }
#endif /* MBEDTLS_CIPHER_MODE_XTS */

    ret = 0;

exit:
    if( ret != 0 && verbose != 0 )
        mbedtls_printf( "failed\n" );

    mbedtls_aes_free( &ctx );

    return( ret );
}